

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::ReferenceContext::deleteTexture(ReferenceContext *this,Texture *texture)

{
  ObjectManager<sglr::rc::Texture> *this_00;
  Texture *pTVar1;
  Framebuffer *pFVar2;
  Framebuffer *pFVar3;
  Framebuffer *pFVar4;
  pointer pTVar5;
  TextureCube **ppTVar6;
  int iVar7;
  int iVar8;
  int point;
  long lVar9;
  long lVar10;
  Attachment *attachment;
  bool bVar11;
  
  pTVar5 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_textureUnits).
                              super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) >> 3) *
          0x2392e827) {
    this_00 = &this->m_textures;
    lVar9 = 0;
    lVar10 = 0;
    do {
      pTVar1 = *(Texture **)((long)&pTVar5->tex1DBinding + lVar9);
      if (pTVar1 == texture) {
        if (pTVar1 != (Texture *)0x0) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
          ppTVar6 = (TextureCube **)
                    ((long)&((this->m_textureUnits).
                             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                             ._M_impl.super__Vector_impl_data._M_start)->tex1DBinding + lVar9);
          goto LAB_018d3380;
        }
      }
      else if (*(Texture **)((long)&pTVar5->tex2DBinding + lVar9) == texture) {
        pTVar1 = *(Texture **)((long)&pTVar5->tex2DBinding + lVar9);
        if (pTVar1 != (Texture *)0x0) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
          ppTVar6 = (TextureCube **)
                    &(this->m_textureUnits).
                     super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar10].tex2DBinding;
          goto LAB_018d3380;
        }
      }
      else if (*(Texture **)
                ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff80U) ==
               texture) {
        pTVar1 = *(Texture **)
                  ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff80U);
        if (pTVar1 != (Texture *)0x0) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
          ppTVar6 = &(this->m_textureUnits).
                     super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar10].texCubeBinding;
          goto LAB_018d3380;
        }
      }
      else if (*(Texture **)
                ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff88U) ==
               texture) {
        pTVar1 = *(Texture **)
                  ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff88U);
        if (pTVar1 != (Texture *)0x0) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
          ppTVar6 = (TextureCube **)
                    &(this->m_textureUnits).
                     super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar10].tex2DArrayBinding;
          goto LAB_018d3380;
        }
      }
      else if (*(Texture **)
                ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff90U) ==
               texture) {
        pTVar1 = *(Texture **)
                  ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff90U);
        if (pTVar1 != (Texture *)0x0) {
          rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
          ppTVar6 = (TextureCube **)
                    &(this->m_textureUnits).
                     super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar10].tex3DBinding;
          goto LAB_018d3380;
        }
      }
      else if ((*(Texture **)
                 ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff98U) ==
                texture) &&
              (pTVar1 = *(Texture **)
                         ((long)(pTVar5->default1DTex).m_levels.m_data + lVar9 + 0xffffffffffffff98U
                         ), pTVar1 != (Texture *)0x0)) {
        rc::ObjectManager<sglr::rc::Texture>::releaseReference(this_00,pTVar1);
        ppTVar6 = (TextureCube **)
                  &(this->m_textureUnits).
                   super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar10].texCubeArrayBinding;
LAB_018d3380:
        *ppTVar6 = (TextureCube *)0x0;
      }
      lVar10 = lVar10 + 1;
      pTVar5 = (this->m_textureUnits).
               super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x3cb8;
    } while (lVar10 < (int)((ulong)((long)(this->m_textureUnits).
                                          super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5)
                           >> 3) * 0x2392e827);
  }
  iVar7 = 0;
  do {
    pFVar2 = *(Framebuffer **)((this->m_clearColor).m_data + (ulong)(iVar7 != 0) * 2 + -0x1a);
    if (pFVar2 != (Framebuffer *)0x0) {
      pFVar3 = this->m_drawFramebufferBinding;
      pFVar4 = this->m_readFramebufferBinding;
      lVar9 = 0;
      do {
        if (pFVar2->m_attachments[lVar9].name == (texture->super_NamedObject).m_name) {
          attachment = pFVar2->m_attachments + lVar9;
          for (iVar8 = (uint)(pFVar2 == pFVar4) + (uint)(pFVar2 == pFVar3); iVar8 != 0;
              iVar8 = iVar8 + -1) {
            releaseFboAttachmentReference(this,attachment);
          }
          attachment->type = ATTACHMENTTYPE_LAST;
          attachment->name = 0;
          attachment->texTarget = TEXTARGET_LAST;
          attachment->level = 0;
          attachment->layer = 0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
    }
    bVar11 = iVar7 == 0;
    iVar7 = iVar7 + 1;
  } while (bVar11);
  rc::ObjectManager<sglr::rc::Texture>::releaseReference(&this->m_textures,texture);
  return;
}

Assistant:

void ReferenceContext::deleteTexture (Texture* texture)
{
	// Unbind from context
	for (int unitNdx = 0; unitNdx < (int)m_textureUnits.size(); unitNdx++)
	{
		if (m_textureUnits[unitNdx].tex1DBinding				== texture)	setTex1DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DBinding			== texture)	setTex2DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeBinding			== texture)	setTexCubeBinding		(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex2DArrayBinding		== texture)	setTex2DArrayBinding	(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].tex3DBinding			== texture)	setTex3DBinding			(unitNdx, DE_NULL);
		else if (m_textureUnits[unitNdx].texCubeArrayBinding	== texture)	setTexCubeArrayBinding	(unitNdx, DE_NULL);
	}

	// Unbind from currently bound framebuffers
	for (int ndx = 0; ndx < 2; ndx++)
	{
		rc::Framebuffer* framebufferBinding = ndx ? m_drawFramebufferBinding : m_readFramebufferBinding;
		if (framebufferBinding)
		{
			int releaseRefCount = (framebufferBinding == m_drawFramebufferBinding ? 1 : 0)
								+ (framebufferBinding == m_readFramebufferBinding ? 1 : 0);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
			{
				Framebuffer::Attachment& attachment = framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
				if (attachment.name == texture->getName())
				{
					for (int refNdx = 0; refNdx < releaseRefCount; refNdx++)
						releaseFboAttachmentReference(attachment);
					attachment = Framebuffer::Attachment();
				}
			}
		}
	}

	DE_ASSERT(texture->getRefCount() == 1);
	m_textures.releaseReference(texture);
}